

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::paint
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  State SVar4;
  QStyleOptionViewItem *option_00;
  ulong uVar5;
  QItemDelegate *in_RCX;
  long in_RDX;
  QRect *in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  CheckState checkState;
  QItemDelegatePrivate *d;
  QRect displayRect;
  QString text;
  QRect checkRect;
  QSize size;
  QRect decorationRect;
  QPixmap pixmap;
  QStyleOptionViewItem opt;
  QVariant value;
  int in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  QItemDelegatePrivate *in_stack_fffffffffffffd20;
  QStyleOptionViewItem *this_00;
  QItemDelegatePrivate *in_stack_fffffffffffffd28;
  undefined1 *puVar7;
  QSize *in_stack_fffffffffffffd30;
  undefined1 **ppuVar8;
  QStyleOptionViewItem *in_stack_fffffffffffffd38;
  QModelIndex *in_stack_fffffffffffffd40;
  QPixmap *this_01;
  QStyleOptionViewItem *in_stack_fffffffffffffd48;
  QModelIndex *index_00;
  undefined4 in_stack_fffffffffffffd58;
  CheckState CVar9;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  undefined1 *local_210;
  QRect *local_208;
  QStyleOptionViewItem *local_200;
  QIcon local_1f8;
  QPalettePrivate *local_1f0;
  QRect *local_1e0;
  QStyleOptionViewItem *local_1d8;
  QIcon local_1d0 [2];
  QRect *local_1c0;
  QStyleOptionViewItem *local_1b8;
  undefined1 *local_1b0;
  QLocale local_1a8;
  QIcon local_1a0;
  QPixmap local_198 [7];
  undefined1 in_stack_fffffffffffffe6f;
  QRect *in_stack_fffffffffffffe70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_stack_fffffffffffffe78;
  QRect *checkRect_00;
  QIcon option_01;
  QItemDelegate *this_02;
  QModelIndex local_158 [8];
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  option_00 = (QStyleOptionViewItem *)d_func((QItemDelegate *)0x85140f);
  memset(local_158,0xaa,0xd0);
  setOptions((QItemDelegate *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38);
  QPainter::save();
  if ((*(bool *)&(option_00->index).r & 1U) != 0) {
    QPainter::setClipRect(in_RSI,(int)local_158 + 0x10);
  }
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)0x8514c3);
  this_02 = (QItemDelegate *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&stack0xfffffffffffffe90);
  QRect::QRect((QRect *)in_stack_fffffffffffffd20);
  QModelIndex::data((QModelIndex *)in_stack_fffffffffffffd38,
                    (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  ::QVariant::operator=((QVariant *)in_stack_fffffffffffffd28,(QVariant *)in_stack_fffffffffffffd20)
  ;
  ::QVariant::~QVariant(&local_48);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffd20);
  if (bVar1) {
    decoration((QItemDelegate *)in_RDI,in_stack_fffffffffffffd48,
               (QVariant *)in_stack_fffffffffffffd40);
    QPixmap::operator=((QPixmap *)in_stack_fffffffffffffd28,(QPixmap *)in_stack_fffffffffffffd20);
    QPixmap::~QPixmap(local_198);
    iVar2 = ::QVariant::userType((QVariant *)0x8515c8);
    if (iVar2 == 0x1005) {
      qvariant_cast<QIcon>((QVariant *)in_stack_fffffffffffffd38);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffd30,(QIcon *)in_stack_fffffffffffffd28);
      QIcon::~QIcon(&local_1a0);
      local_1a8._4_4_ = *(undefined4 *)(in_RDX + 8);
      MVar3 = QItemDelegatePrivate::iconMode
                        ((QItemDelegatePrivate *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
                         SUB84((ulong)in_stack_fffffffffffffd28 >> 0x20,0));
      *(Mode *)&(option_00->text).d.ptr = MVar3;
      local_1a8._0_4_ = *(undefined4 *)(in_RDX + 8);
      SVar4 = QItemDelegatePrivate::iconState
                        (in_stack_fffffffffffffd20,
                         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
                         SUB84((ulong)in_stack_fffffffffffffd28 >> 0x20,0));
      *(State *)((long)&(option_00->text).d.ptr + 4) = SVar4;
      local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1b0 = (undefined1 *)
                  QIcon::actualSize((QSize *)&option_00->text,(int)in_RDX + 0x50,
                                    *(State *)&(option_00->text).d.ptr);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                     in_stack_fffffffffffffd18);
      QRect::QRect((QRect *)in_stack_fffffffffffffd40,(QPoint *)in_stack_fffffffffffffd38,
                   in_stack_fffffffffffffd30);
      iVar2 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
      checkRect_00 = local_1c0;
      option_01.d = (QIconPrivate *)local_1b8;
    }
    else {
      QIcon::QIcon(local_1d0);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffd30,(QIcon *)in_stack_fffffffffffffd28);
      QIcon::~QIcon(local_1d0);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                     in_stack_fffffffffffffd18);
      local_1f0 = (QPalettePrivate *)QPixmap::size();
      QRect::QRect((QRect *)in_stack_fffffffffffffd40,(QPoint *)in_stack_fffffffffffffd38,
                   in_stack_fffffffffffffd30);
      iVar2 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
      checkRect_00 = local_1e0;
      option_01.d = (QIconPrivate *)local_1d8;
    }
  }
  else {
    QIcon::QIcon(&local_1f8);
    QIcon::operator=((QIcon *)in_stack_fffffffffffffd30,(QIcon *)in_stack_fffffffffffffd28);
    iVar2 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
    QIcon::~QIcon(&local_1f8);
    QRect::QRect((QRect *)in_stack_fffffffffffffd20);
    checkRect_00 = local_208;
    option_01.d = (QIconPrivate *)local_200;
  }
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  local_210 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffd20);
  CVar9 = Unchecked;
  QModelIndex::data((QModelIndex *)in_stack_fffffffffffffd38,iVar2);
  ::QVariant::operator=((QVariant *)in_stack_fffffffffffffd28,(QVariant *)in_stack_fffffffffffffd20)
  ;
  ::QVariant::~QVariant(&local_68);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffd20);
  if (bVar1) {
    CVar9 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>
                      ((QVariant *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    local_228 = (undefined1  [16])
                doCheck(in_RCX,option_00,(QRect *)CONCAT44(CVar9,in_stack_fffffffffffffd58),
                        (QVariant *)in_RDI);
    local_218 = (undefined1 *)local_228._0_8_;
    local_210 = (undefined1 *)local_228._8_8_;
  }
  local_240 = &DAT_aaaaaaaaaaaaaaaa;
  local_238 = &DAT_aaaaaaaaaaaaaaaa;
  local_230 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x85191a);
  local_250 = &DAT_aaaaaaaaaaaaaaaa;
  local_248 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffd20);
  QModelIndex::data((QModelIndex *)in_stack_fffffffffffffd38,iVar2);
  ::QVariant::operator=((QVariant *)in_stack_fffffffffffffd28,(QVariant *)in_stack_fffffffffffffd20)
  ;
  ::QVariant::~QVariant(&local_88);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffd20);
  if ((bVar1) && (uVar5 = ::QVariant::isNull(), (uVar5 & 1) == 0)) {
    QItemDelegatePrivate::valueToText
              (in_stack_fffffffffffffd28,(QVariant *)in_stack_fffffffffffffd20,
               (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
              );
    QString::operator=((QString *)in_stack_fffffffffffffd20,
                       (QString *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    QString::~QString((QString *)0x8519ea);
    QVar6 = QItemDelegatePrivate::displayRect
                      ((QItemDelegatePrivate *)option_00,
                       (QModelIndex *)CONCAT44(CVar9,in_stack_fffffffffffffd58),in_RDI,
                       (QRect *)in_stack_fffffffffffffd48,(QRect *)in_stack_fffffffffffffd40);
    local_278 = QVar6._0_8_;
    local_250 = local_278;
    local_270 = QVar6._8_8_;
    local_248 = local_270;
  }
  index_00 = local_158;
  this_00 = (QStyleOptionViewItem *)&local_218;
  puVar7 = &stack0xfffffffffffffe80;
  ppuVar8 = &local_250;
  doLayout(this_02,(QStyleOptionViewItem *)option_01.d,checkRect_00,
           (QRect *)in_stack_fffffffffffffe78.ptr,in_stack_fffffffffffffe70,
           (bool)in_stack_fffffffffffffe6f);
  drawBackground((QItemDelegate *)option_00,(QPainter *)CONCAT44(CVar9,in_stack_fffffffffffffd58),
                 in_RDI,index_00);
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 200))(in_RDI,in_RSI,index_00,this_00,CVar9);
  this_01 = (QPixmap *)&stack0xfffffffffffffe90;
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0xb8))(in_RDI,in_RSI,index_00,puVar7);
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0xb0))(in_RDI,in_RSI,index_00,ppuVar8);
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0xc0))(in_RDI,in_RSI,index_00,ppuVar8);
  QPainter::restore();
  QString::~QString((QString *)0x851b42);
  QPixmap::~QPixmap(this_01);
  ::QVariant::~QVariant((QVariant *)&local_28);
  QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = setOptions(index, option);

    // prepare
    painter->save();
    if (d->clipPainting)
        painter->setClipRect(opt.rect);

    // get the data and the rectangles

    QVariant value;

    QPixmap pixmap;
    QRect decorationRect;
    value = index.data(Qt::DecorationRole);
    if (value.isValid()) {
        // ### we need the pixmap to call the virtual function
        pixmap = decoration(opt, value);
        if (value.userType() == QMetaType::QIcon) {
            d->tmp.icon = qvariant_cast<QIcon>(value);
            d->tmp.mode = d->iconMode(option.state);
            d->tmp.state = d->iconState(option.state);
            const QSize size = d->tmp.icon.actualSize(option.decorationSize,
                                                      d->tmp.mode, d->tmp.state);
            decorationRect = QRect(QPoint(0, 0), size);
        } else {
            d->tmp.icon = QIcon();
            decorationRect = QRect(QPoint(0, 0), pixmap.size());
        }
    } else {
        d->tmp.icon = QIcon();
        decorationRect = QRect();
    }

    QRect checkRect;
    Qt::CheckState checkState = Qt::Unchecked;
    value = index.data(Qt::CheckStateRole);
    if (value.isValid()) {
        checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
        checkRect = doCheck(opt, opt.rect, value);
    }

    QString text;
    QRect displayRect;
    value = index.data(Qt::DisplayRole);
    if (value.isValid() && !value.isNull()) {
        text = d->valueToText(value, opt);
        displayRect = d->displayRect(index, opt, decorationRect, checkRect);
    }

    // do the layout

    doLayout(opt, &checkRect, &decorationRect, &displayRect, false);

    // draw the item

    drawBackground(painter, opt, index);
    drawCheck(painter, opt, checkRect, checkState);
    drawDecoration(painter, opt, decorationRect, pixmap);
    drawDisplay(painter, opt, displayRect, text);
    drawFocus(painter, opt, displayRect);

    // done
    painter->restore();
}